

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainEth1394.cpp
# Opt level: O0

void TestBlockWrite(uint wlen_max,AmpIO *wboard,AmpIO *rboard)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  ushort uVar4;
  ushort uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  ostream *poVar9;
  void *pvVar10;
  uint local_1074;
  bool allOK;
  bool bw_err;
  uint bw_err_cnt;
  unsigned_short bw_wait;
  unsigned_short bw_left;
  uint trigger_comp;
  double trigger;
  uint len16;
  bool doOut;
  uint wlen;
  char *cptr;
  uint debugVersion;
  uint fpgaVer;
  uint numSilentMismatch;
  uint max_wlen;
  uint max_wait;
  uint min_wlen;
  uint min_left;
  uint i;
  quadlet_t waveform_read [512];
  quadlet_t waveform [512];
  AmpIO *rboard_local;
  AmpIO *wboard_local;
  uint wlen_max_local;
  
  numSilentMismatch = 0;
  debugVersion = 0;
  uVar6 = BoardIO::GetFpgaVersionMajor((BoardIO *)rboard);
  if ((uVar6 < 2) || (3 < uVar6)) {
    poVar9 = std::operator<<((ostream *)&std::cout,"TestBlockWrite: unsupported FPGA Version: ");
    pvVar10 = (void *)std::ostream::operator<<(poVar9,uVar6);
    std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
  }
  else {
    bVar1 = false;
    bVar2 = FpgaIO::ReadEthernetData(&rboard->super_FpgaIO,&min_left,0x80,0x10);
    if (bVar2) {
      iVar7 = strncmp((char *)&min_left,"DBG2",4);
      if (iVar7 != 0) {
        poVar9 = std::operator<<((ostream *)&std::cout,"Debug data not available");
        std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
        poVar9 = std::operator<<((ostream *)&std::cout,"Will only perform read/write test");
        std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
      }
      bVar1 = iVar7 == 0;
    }
    fpgaVer = wlen_max;
    max_wlen = wlen_max;
    max_wait = wlen_max;
    for (len16 = 2; len16 < wlen_max; len16 = len16 + 1) {
      bVar2 = true;
      if ((9 < len16) && (bVar2 = true, len16 % 0x14 != 0)) {
        bVar2 = len16 == wlen_max - 1;
      }
      if (uVar6 == 2) {
        uVar8 = ((len16 & 0x7fffffff) + ((len16 << 1) >> 3)) - ((len16 << 1) >> 6);
        _bw_wait = (double)(len16 * 3 - 2) / 5.0;
      }
      else {
        uVar8 = len16 & 0x7fffffff;
        _bw_wait = (double)(len16 - 1) / 2.0;
      }
      if (bVar2) {
        poVar9 = std::operator<<((ostream *)&std::cout,"Len=");
        pvVar10 = (void *)std::ostream::operator<<(poVar9,std::dec);
        poVar9 = (ostream *)std::ostream::operator<<(pvVar10,len16);
        std::operator<<(poVar9,": ");
        if (bVar1) {
          poVar9 = std::operator<<((ostream *)&std::cout,"trigger = ");
          poVar9 = (ostream *)std::ostream::operator<<(poVar9,_bw_wait);
          poVar9 = std::operator<<(poVar9,", trigger_fpga = ");
          poVar9 = (ostream *)std::ostream::operator<<(poVar9,uVar8 + 2 >> 1);
          std::operator<<(poVar9,", ");
        }
      }
      for (min_wlen = 0; min_wlen < len16; min_wlen = min_wlen + 1) {
        waveform_read[(ulong)min_wlen + 0x1fe] = (len16 + min_wlen) * 0x10000 | len16 - min_wlen;
        (&min_left)[min_wlen] = 0;
      }
      bVar3 = AmpIO::WriteWaveformTable(wboard,waveform_read + 0x1fe,0,(unsigned_short)len16);
      if (!bVar3) {
        if (!bVar2) {
          poVar9 = std::operator<<((ostream *)&std::cout,"Len=");
          pvVar10 = (void *)std::ostream::operator<<(poVar9,std::dec);
          poVar9 = (ostream *)std::ostream::operator<<(pvVar10,len16);
          std::operator<<(poVar9,": ");
        }
        poVar9 = std::operator<<((ostream *)&std::cout,"WriteWaveformTable failed");
        std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
        return;
      }
      Amp1394_Sleep(0.05);
      if (bVar1) {
        bVar3 = FpgaIO::ReadEthernetData(&rboard->super_FpgaIO,&min_left,0x80,0x10);
        if (!bVar3) break;
        uVar8 = 0x4a0;
        if (uVar6 == 2) {
          uVar8 = 0x90;
        }
        bVar3 = FpgaIO::ReadEthernetData(&rboard->super_FpgaIO,waveform_read + 0xe,uVar8,5);
        if (!bVar3) break;
        uVar4 = (ushort)(waveform_read[6] >> 0x10);
        local_1074 = (uint)((waveform_read[6] & 0x8000) != 0);
        uVar5 = (ushort)(waveform_read[0x12] >> 0x10);
        if (uVar4 < max_wait) {
          max_wait = (uint)uVar4;
          max_wlen = len16;
        }
        if (numSilentMismatch < uVar5) {
          numSilentMismatch = (uint)uVar5;
          fpgaVer = len16;
        }
        if (bVar2) {
          poVar9 = std::operator<<((ostream *)&std::cout,"bw_left = ");
          poVar9 = (ostream *)std::ostream::operator<<(poVar9,uVar4);
          poVar9 = std::operator<<(poVar9,", bw_wait = ");
          std::ostream::operator<<(poVar9,uVar5);
          if (local_1074 != 0) {
            poVar9 = std::operator<<((ostream *)&std::cout,", bw_err_cnt = ");
            std::ostream::operator<<(poVar9,local_1074);
          }
          std::operator<<((ostream *)&std::cout,", ");
        }
      }
      bVar3 = AmpIO::ReadWaveformTable(rboard,&min_left,0,(unsigned_short)len16);
      if (!bVar3) {
        if (!bVar2) {
          poVar9 = std::operator<<((ostream *)&std::cout,"Len=");
          pvVar10 = (void *)std::ostream::operator<<(poVar9,std::dec);
          poVar9 = (ostream *)std::ostream::operator<<(pvVar10,len16);
          std::operator<<(poVar9,": ");
        }
        poVar9 = std::operator<<((ostream *)&std::cout,"ReadWaveformTable failed");
        std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
        break;
      }
      bVar3 = true;
      for (min_wlen = 0; min_wlen < len16; min_wlen = min_wlen + 1) {
        if ((&min_left)[min_wlen] != waveform_read[(ulong)min_wlen + 0x1fe]) {
          bVar3 = false;
          if (bVar2) {
            poVar9 = std::operator<<((ostream *)&std::cout,"mismatch at quadlet ");
            pvVar10 = (void *)std::ostream::operator<<(poVar9,std::dec);
            poVar9 = (ostream *)std::ostream::operator<<(pvVar10,min_wlen);
            poVar9 = std::operator<<(poVar9,", read ");
            pvVar10 = (void *)std::ostream::operator<<(poVar9,std::hex);
            poVar9 = (ostream *)std::ostream::operator<<(pvVar10,(&min_left)[min_wlen]);
            poVar9 = std::operator<<(poVar9,", expected ");
            std::ostream::operator<<(poVar9,waveform_read[(ulong)min_wlen + 0x1fe]);
            if (debugVersion != 0) {
              poVar9 = (ostream *)
                       std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
              poVar9 = std::operator<<(poVar9,"There were ");
              pvVar10 = (void *)std::ostream::operator<<(poVar9,std::dec);
              poVar9 = (ostream *)std::ostream::operator<<(pvVar10,debugVersion);
              std::operator<<(poVar9," additional lengths with mismatches");
              debugVersion = 0;
            }
          }
          else {
            debugVersion = debugVersion + 1;
          }
          break;
        }
      }
      if (bVar2) {
        if ((!bVar1) && (bVar3)) {
          std::operator<<((ostream *)&std::cout," Pass");
        }
        std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
      }
    }
    if (debugVersion != 0) {
      poVar9 = std::operator<<((ostream *)&std::cout,"There were ");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,debugVersion);
      poVar9 = std::operator<<(poVar9," additional lengths with mismatches");
      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    }
    if (bVar1) {
      poVar9 = std::operator<<((ostream *)&std::cout,"Mininum bw_left = ");
      pvVar10 = (void *)std::ostream::operator<<(poVar9,std::dec);
      poVar9 = (ostream *)std::ostream::operator<<(pvVar10,max_wait);
      poVar9 = std::operator<<(poVar9," at wlen = ");
      pvVar10 = (void *)std::ostream::operator<<(poVar9,max_wlen);
      std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
      poVar9 = std::operator<<((ostream *)&std::cout,"Maximum bw_wait = ");
      pvVar10 = (void *)std::ostream::operator<<(poVar9,std::dec);
      poVar9 = (ostream *)std::ostream::operator<<(pvVar10,numSilentMismatch);
      poVar9 = std::operator<<(poVar9," at wlen = ");
      pvVar10 = (void *)std::ostream::operator<<(poVar9,fpgaVer);
      std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
    }
  }
  return;
}

Assistant:

void TestBlockWrite(unsigned int wlen_max, AmpIO *wboard, AmpIO *rboard)
{
    quadlet_t waveform[MAX_POSSIBLE_DATA_SIZE/sizeof(quadlet_t)];
    quadlet_t waveform_read[MAX_POSSIBLE_DATA_SIZE/sizeof(quadlet_t)];
    unsigned int i;
    unsigned int min_left = wlen_max;
    unsigned int min_wlen = wlen_max;
    unsigned int max_wait = 0;
    unsigned int max_wlen = wlen_max;
    unsigned int numSilentMismatch = 0;

    // Get FPGA Version
    unsigned int fpgaVer = rboard->GetFpgaVersionMajor();
    if ((fpgaVer < 2) || (fpgaVer > 3)) {
        std::cout << "TestBlockWrite: unsupported FPGA Version: " << fpgaVer << std::endl;
        return;
    }

    // Check if debug data available, in which case we can query bw_left
    unsigned int debugVersion = 0;
    if (rboard->ReadEthernetData(waveform_read, 0x80, 16)) {
        char *cptr = reinterpret_cast<char *>(waveform_read);
        if (strncmp(cptr, "DBG2", 4) == 0) {
            debugVersion = 2;
        }
        else {
            std::cout << "Debug data not available" << std::endl;
            std::cout << "Will only perform read/write test" << std::endl;
        }
    }

    for (unsigned int wlen = 2; wlen < wlen_max; wlen++) {
        bool doOut = ((wlen<10)||(wlen%20 == 0)||(wlen==wlen_max-1));
        unsigned int len16 = 2*wlen;  // length in words
        double trigger;               // actual trigger value
        unsigned int trigger_comp;    // trigger computation on FPGA
        if (fpgaVer == 2) {
            trigger_comp = 10 + len16/2+len16/8-len16/64 + 2; // FPGA V2 (KSZ8851)
            trigger = (3*wlen-2)/5.0;
        }
        else {
            trigger_comp = 10 + len16/2 + 2;   // FPGA V3 (RTL8211F)
            trigger = (wlen-1)/2.0;
        }
        if (doOut) {
            std::cout << "Len=" << std::dec << wlen << ": ";
            if (debugVersion) {
                std::cout << "trigger = " << trigger
                          << ", trigger_fpga = " << (trigger_comp-10)/2 << ", ";
            }
        }
        for (i = 0; i < wlen; i++) {
            waveform[i] = ((wlen+i)<< 16) | (wlen-i);
            waveform_read[i] = 0;
        }
        if (!wboard->WriteWaveformTable(waveform, 0, wlen)) {
            if (!doOut) std::cout << "Len=" << std::dec << wlen << ": ";
            std::cout << "WriteWaveformTable failed" << std::endl;
            return;
        }
        Amp1394_Sleep(0.05);
        if (debugVersion) {
            // Read 16 quadlets to get EthernetIO debug data (0x80-0x8f)
            if (!rboard->ReadEthernetData(waveform_read, 0x80, 16))
                break;
            // Read next 5 quadlets to get low-level debug data:
            // KSZ (0x90) or RTI (0x4a0)
            if (!rboard->ReadEthernetData(&waveform_read[16], (fpgaVer == 2) ? 0x90 : 0x4a0, 5))
                break;
            unsigned short bw_left = 0;
            unsigned short bw_wait = 0;
            unsigned int bw_err_cnt = 0;
            bw_left = static_cast<unsigned short>(waveform_read[8]>>16);
            bool bw_err = (waveform_read[8] & 0x00008000);
            if (bw_err) {
                bw_err_cnt++;
            }
            // For both KSZ and RTI, bw_wait is upper word of DebugData[4]
            bw_wait = static_cast<unsigned short>(waveform_read[20]>>16);
            if (bw_left < min_left) {
                min_left = bw_left;
                min_wlen = wlen;
            }
            if (bw_wait > max_wait) {
                max_wait = bw_wait;
                max_wlen = wlen;
            }
            if (doOut) {
                std::cout << "bw_left = " << bw_left << ", bw_wait = " << bw_wait;
                if (bw_err_cnt > 0) {
                    std::cout << ", bw_err_cnt = " << bw_err_cnt;
                    bw_err_cnt = 0;
                }
                std::cout << ", ";
            }
        }
        if (!rboard->ReadWaveformTable(waveform_read, 0, wlen)) {
            if (!doOut) std::cout << "Len=" << std::dec << wlen << ": ";
            std::cout << "ReadWaveformTable failed" << std::endl;
            break;
        }
        bool allOK = true;
        for (i = 0; i < wlen; i++) {
            if (waveform_read[i] != waveform[i]) {
                allOK = false;
                if (doOut) {
                    std::cout << "mismatch at quadlet " << std::dec << i << ", read "
                              << std::hex << waveform_read[i] << ", expected " << waveform[i];
                    if (numSilentMismatch > 0) {
                        std::cout << std::endl << "There were " << std::dec << numSilentMismatch
                                  << " additional lengths with mismatches";
                        numSilentMismatch = 0;
                    }
                }
                else
                    numSilentMismatch++;
                break;
            }
        }
        if (doOut) {
            if (!debugVersion && allOK) std::cout << " Pass";
            std::cout << std::endl;
        }
    }
    if (numSilentMismatch > 0) {
        std::cout << "There were " << numSilentMismatch << " additional lengths with mismatches" << std::endl;
    }
    if (debugVersion) {
        std::cout << "Mininum bw_left = " << std::dec << min_left << " at wlen = " << min_wlen << std::endl;
        std::cout << "Maximum bw_wait = " << std::dec << max_wait << " at wlen = " << max_wlen << std::endl;
    }
}